

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkref.c
# Opt level: O1

void nn_chunkref_init(nn_chunkref *self,size_t size)

{
  int iVar1;
  undefined8 uVar2;
  
  if (size < 0x20) {
    (self->u).ref[0] = (uint8_t)size;
  }
  else {
    (self->u).ref[0] = 0xff;
    uVar2 = 0;
    iVar1 = nn_chunk_alloc(size,0,(void **)((long)&self->u + 8));
    if (iVar1 != 0) {
      nn_chunkref_init_cold_1();
      *(undefined1 *)size = 0xff;
      *(undefined8 *)(size + 8) = uVar2;
      return;
    }
  }
  return;
}

Assistant:

void nn_chunkref_init (struct nn_chunkref *self, size_t size)
{
    int rc;
    struct nn_chunkref_chunk *ch;

    if (size < NN_CHUNKREF_MAX) {
        self->u.ref [0] = (uint8_t) size;
        return;
    }

    ch = (struct nn_chunkref_chunk*) self;
    ch->tag = 0xff;
    rc = nn_chunk_alloc (size, 0, &ch->chunk);
    errno_assert (rc == 0);
}